

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  Guard_t GVar1;
  mutex_type *pmVar2;
  reference __x;
  bool local_41;
  size_type end;
  Guard_t g;
  Size_t from_local;
  Move_iterator *this_local;
  
  g._M_device = (mutex_type *)from;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&end,this->mtx_);
  pmVar2 = (mutex_type *)
           std::
           vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           ::size(this->events_);
  if (g._M_device != pmVar2) {
    do {
      g._M_device = (mutex_type *)((long)&((g._M_device)->super___mutex_base)._M_mutex.__align + 1);
      local_41 = false;
      if (g._M_device != pmVar2) {
        __x = std::
              vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
              ::operator[](this->events_,(size_type)g._M_device);
        local_41 = std::operator==(__x,(nullptr_t)0x0);
      }
    } while (local_41 != false);
  }
  GVar1._M_device = g._M_device;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&end);
  return (Size_t)GVar1._M_device;
}

Assistant:

auto find_next(Size_t from) -> Size_t
            {
                Guard_t g{mtx_};
                const auto end = events_.size();
                if (from == end)
                    return from;
                while (++from != end && events_[from] == nullptr) {}
                return from;
            }